

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O1

int MRIStepGetNumRhsEvals(void *arkode_mem,long *nfse_evals,long *nfsi_evals)

{
  int iVar1;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem local_20;
  ARKodeMem local_18;
  
  iVar1 = mriStep_AccessARKODEStepMem(arkode_mem,"MRIStepGetNumRhsEvals",&local_18,&local_20);
  if (iVar1 == 0) {
    *nfse_evals = local_20->nfse;
    *nfsi_evals = local_20->nfsi;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int MRIStepGetNumRhsEvals(void* arkode_mem, long int* nfse_evals,
                          long int* nfsi_evals)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMem and ARKodeMRIStepMem structures */
  retval = mriStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* get number of fse and fsi evals from step_mem */
  *nfse_evals = step_mem->nfse;
  *nfsi_evals = step_mem->nfsi;

  return (ARK_SUCCESS);
}